

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR yang_parse_submodule
                 (lysp_yang_ctx **context,ly_ctx *ly_ctx,lysp_ctx *main_ctx,ly_in *in,
                 lysp_submodule **submod)

{
  lysp_submodule *plVar1;
  ly_ht *plVar2;
  char *pcVar3;
  size_t sVar4;
  ly_ctx *local_98;
  ly_ctx *local_88;
  undefined1 local_80 [8];
  lysf_ctx fctx;
  lysp_submodule *mod_p;
  ly_stmt kw;
  size_t word_len;
  char *word;
  anon_union_8_3_0df1e6ad_for_ly_set_2 *paStack_38;
  LY_ERR ret;
  lysp_submodule **submod_local;
  ly_in *in_local;
  lysp_ctx *main_ctx_local;
  ly_ctx *ly_ctx_local;
  lysp_yang_ctx **context_local;
  
  word._4_4_ = 0;
  fctx.ext_set.field_2.dnodes = (lyd_node **)0x0;
  paStack_38 = (anon_union_8_3_0df1e6ad_for_ly_set_2 *)submod;
  submod_local = (lysp_submodule **)in;
  in_local = (ly_in *)main_ctx;
  main_ctx_local = (lysp_ctx *)ly_ctx;
  ly_ctx_local = (ly_ctx *)context;
  memset(local_80,0,0x20);
  local_80 = (undefined1  [8])main_ctx_local;
  if ((((ly_ctx_local != (ly_ctx *)0x0) && (main_ctx_local != (lysp_ctx *)0x0)) &&
      (in_local != (ly_in *)0x0)) &&
     ((submod_local != (lysp_submodule **)0x0 &&
      (paStack_38 != (anon_union_8_3_0df1e6ad_for_ly_set_2 *)0x0)))) {
    plVar2 = (ly_ht *)calloc(1,0x60);
    (ly_ctx_local->dict).hash_tab = plVar2;
    if ((ly_ctx_local->dict).hash_tab == (ly_ht *)0x0) {
      ly_log((ly_ctx *)main_ctx_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "yang_parse_submodule");
      context_local._4_4_ = LY_EMEM;
    }
    else {
      ((ly_ctx_local->dict).hash_tab)->used = 1;
      *(lysp_submodule ***)&(ly_ctx_local->dict).hash_tab[1].resize = submod_local;
      (ly_ctx_local->dict).hash_tab[1].cb_data = in_local;
      fctx.ext_set.field_2.dnodes = (lyd_node **)calloc(1,0xb8);
      if (fctx.ext_set.field_2.dnodes == (lyd_node **)0x0) {
        ly_log((ly_ctx *)main_ctx_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "yang_parse_submodule");
        word._4_4_ = LY_EMEM;
      }
      else {
        *fctx.ext_set.field_2.dnodes =
             (lyd_node *)
             **(undefined8 **)
               (*(long *)(in_local->line + 8) + (ulong)(*(int *)(in_local->line + 4) - 1) * 8);
        *(byte *)((long)fctx.ext_set.field_2.dnodes + 0x79) =
             *(byte *)((long)fctx.ext_set.field_2.dnodes + 0x79) & 0xfe | 1;
        (ly_ctx_local->dict).hash_tab[1].val_equal = (lyht_value_equal_cb)in_local->line;
        ly_set_add((ly_set *)(ly_ctx_local->dict).hash_tab[1].val_equal,fctx.ext_set.field_2.dnodes,
                   '\x01',(uint32_t *)0x0);
        ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,(char *)0x0,(ly_in *)submod_local);
        word._4_4_ = skip_redundant_chars((lysp_yang_ctx *)(ly_ctx_local->dict).hash_tab);
        if ((word._4_4_ == LY_SUCCESS) &&
           (word._4_4_ = get_keyword((lysp_yang_ctx *)(ly_ctx_local->dict).hash_tab,
                                     (ly_stmt *)((long)&mod_p + 4),(char **)&word_len,
                                     (size_t *)&stack0xffffffffffffffb0), word._4_4_ == LY_SUCCESS))
        {
          if (mod_p._4_4_ == LY_STMT_MODULE) {
            ly_log((ly_ctx *)main_ctx_local,LY_LLERR,LY_EDENIED,
                   "Input data contains module in situation when a submodule is expected.");
            word._4_4_ = LY_EINVAL;
          }
          else if (mod_p._4_4_ == LY_STMT_SUBMODULE) {
            word._4_4_ = parse_submodule((lysp_yang_ctx *)(ly_ctx_local->dict).hash_tab,
                                         (lysp_submodule *)fctx.ext_set.field_2.dnodes);
            if ((word._4_4_ == LY_SUCCESS) &&
               (word._4_4_ = skip_redundant_chars((lysp_yang_ctx *)(ly_ctx_local->dict).hash_tab),
               word._4_4_ == LY_SUCCESS)) {
              if (*(char *)&submod_local[1]->mod == '\0') {
                *(byte *)((long)fctx.ext_set.field_2.dnodes + 0x79) =
                     *(byte *)((long)fctx.ext_set.field_2.dnodes + 0x79) & 0xfe;
                *paStack_38 = fctx.ext_set.field_2;
              }
              else {
                if ((ly_ctx_local->dict).hash_tab == (ly_ht *)0x0) {
                  local_98 = (ly_ctx *)0x0;
                }
                else {
                  local_98 = *(ly_ctx **)
                              **(undefined8 **)
                                (*(long *)((ly_ctx_local->dict).hash_tab[1].val_equal + 8) +
                                (ulong)(*(int *)((ly_ctx_local->dict).hash_tab[1].val_equal + 4) - 1
                                       ) * 8);
                }
                plVar1 = submod_local[1];
                sVar4 = strlen((char *)submod_local[1]);
                pcVar3 = "";
                if (0xf < sVar4) {
                  pcVar3 = "...";
                }
                ly_vlog(local_98,(char *)0x0,LYVE_SYNTAX,
                        "Trailing garbage \"%.*s%s\" after submodule, expected end-of-input.",0xf,
                        plVar1,pcVar3);
                word._4_4_ = LY_EVALID;
              }
            }
          }
          else {
            if ((ly_ctx_local->dict).hash_tab == (ly_ht *)0x0) {
              local_88 = (ly_ctx *)0x0;
            }
            else {
              local_88 = *(ly_ctx **)
                          **(undefined8 **)
                            (*(long *)((ly_ctx_local->dict).hash_tab[1].val_equal + 8) +
                            (ulong)(*(int *)((ly_ctx_local->dict).hash_tab[1].val_equal + 4) - 1) *
                            8);
            }
            pcVar3 = lyplg_ext_stmt2str(mod_p._4_4_);
            ly_vlog(local_88,(char *)0x0,LYVE_SYNTAX,
                    "Invalid keyword \"%s\", expected \"module\" or \"submodule\".",pcVar3);
            word._4_4_ = LY_EVALID;
          }
        }
      }
      ly_log_location_revert(0,0,0,1);
      if (word._4_4_ != LY_SUCCESS) {
        lysp_module_free((lysf_ctx *)local_80,(lysp_module *)fctx.ext_set.field_2.dnodes);
        lysp_yang_ctx_free((lysp_yang_ctx *)(ly_ctx_local->dict).hash_tab);
        (ly_ctx_local->dict).hash_tab = (ly_ht *)0x0;
      }
      context_local._4_4_ = word._4_4_;
    }
    return context_local._4_4_;
  }
  __assert_fail("context && ly_ctx && main_ctx && in && submod",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                ,0x1297,
                "LY_ERR yang_parse_submodule(struct lysp_yang_ctx **, struct ly_ctx *, struct lysp_ctx *, struct ly_in *, struct lysp_submodule **)"
               );
}

Assistant:

LY_ERR
yang_parse_submodule(struct lysp_yang_ctx **context, struct ly_ctx *ly_ctx, struct lysp_ctx *main_ctx,
        struct ly_in *in, struct lysp_submodule **submod)
{
    LY_ERR ret = LY_SUCCESS;
    char *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_submodule *mod_p = NULL;
    struct lysf_ctx fctx = {.ctx = ly_ctx};

    assert(context && ly_ctx && main_ctx && in && submod);

    /* create context */
    *context = calloc(1, sizeof **context);
    LY_CHECK_ERR_RET(!(*context), LOGMEM(ly_ctx), LY_EMEM);
    (*context)->format = LYS_IN_YANG;
    (*context)->in = in;
    (*context)->main_ctx = main_ctx;

    mod_p = calloc(1, sizeof *mod_p);
    LY_CHECK_ERR_GOTO(!mod_p, LOGMEM(ly_ctx); ret = LY_EMEM, cleanup);
    mod_p->mod = PARSER_CUR_PMOD(main_ctx)->mod;
    mod_p->parsing = 1;

    /* use main context parsed mods adding the current one */
    (*context)->parsed_mods = main_ctx->parsed_mods;
    ly_set_add((*context)->parsed_mods, mod_p, 1, NULL);

    ly_log_location(NULL, NULL, NULL, in);

    /* skip redundant but valid characters at the beginning */
    ret = skip_redundant_chars(*context);
    LY_CHECK_GOTO(ret, cleanup);

    /* "module"/"submodule" */
    ret = get_keyword(*context, &kw, &word, &word_len);
    LY_CHECK_GOTO(ret, cleanup);

    if (kw == LY_STMT_MODULE) {
        LOGERR(ly_ctx, LY_EDENIED, "Input data contains module in situation when a submodule is expected.");
        ret = LY_EINVAL;
        goto cleanup;
    } else if (kw != LY_STMT_SUBMODULE) {
        LOGVAL_PARSER(*context, LY_VCODE_MOD_SUBOMD, lyplg_ext_stmt2str(kw));
        ret = LY_EVALID;
        goto cleanup;
    }

    /* substatements */
    ret = parse_submodule(*context, mod_p);
    LY_CHECK_GOTO(ret, cleanup);

    /* skip redundant but valid characters at the end */
    ret = skip_redundant_chars(*context);
    LY_CHECK_GOTO(ret, cleanup);
    if (in->current[0]) {
        LOGVAL_PARSER(*context, LY_VCODE_TRAILING_SUBMOD, 15, in->current, strlen(in->current) > 15 ? "..." : "");
        ret = LY_EVALID;
        goto cleanup;
    }

    mod_p->parsing = 0;
    *submod = mod_p;

cleanup:
    ly_log_location_revert(0, 0, 0, 1);
    if (ret) {
        lysp_module_free(&fctx, (struct lysp_module *)mod_p);
        lysp_yang_ctx_free(*context);
        *context = NULL;
    }

    return ret;
}